

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_dart_struct_writer(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  e_req eVar1;
  bool bVar2;
  ostream *poVar3;
  t_field *ptVar4;
  pointer pptVar5;
  t_dart_generator *ptVar6;
  string field_name;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_190);
  std::operator<<(poVar3,"write(TProtocol oprot)");
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_150," ",(allocator *)&local_190);
  scope_up(this,out,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"validate();");
  std::operator<<(poVar3,(string *)&endl2_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"oprot.writeStructBegin(_STRUCT_DESC);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  for (pptVar5 = (tstruct->members_in_id_order_).
                 super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    ptVar6 = (t_dart_generator *)&(*pptVar5)->name_;
    std::__cxx11::string::string((string *)&local_50,(string *)ptVar6);
    get_member_name(&local_190,ptVar6,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    ptVar4 = *pptVar5;
    eVar1 = ptVar4->req_;
    if (eVar1 == T_OPTIONAL) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"if (");
      generate_isset_check_abi_cxx11_(&local_170,this,*pptVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_170);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::string((string *)&local_70," ",(allocator *)&local_170);
      scope_up(this,out,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      ptVar4 = *pptVar5;
    }
    bVar2 = type_can_be_null(this,ptVar4->type_);
    if (bVar2) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"if (this.");
      poVar3 = std::operator<<(poVar3,(string *)&local_190);
      std::operator<<(poVar3," != null)");
      std::__cxx11::string::string((string *)&local_90," ",(allocator *)&local_170);
      scope_up(this,out,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"oprot.writeFieldBegin(_");
    ptVar6 = (t_dart_generator *)&(*pptVar5)->name_;
    std::__cxx11::string::string((string *)&local_110,(string *)ptVar6);
    constant_name(&local_170,ptVar6,&local_110);
    poVar3 = std::operator<<(poVar3,(string *)&local_170);
    poVar3 = std::operator<<(poVar3,"_FIELD_DESC);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_110);
    ptVar4 = *pptVar5;
    std::__cxx11::string::string((string *)&local_b0,"this.",(allocator *)&local_170);
    generate_serialize_field(this,out,ptVar4,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"oprot.writeFieldEnd();");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_d0,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if (eVar1 == T_OPTIONAL) {
      std::__cxx11::string::string((string *)&local_f0,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::~string((string *)&local_190);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"oprot.writeFieldStop();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_190);
  poVar3 = std::operator<<(poVar3,"oprot.writeStructEnd();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_130,(string *)&endl2_abi_cxx11_);
  scope_down(this,out,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_writer(ostream& out, t_struct* tstruct) {
  out << indent() << "write(TProtocol oprot)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl2;

  indent(out) << "oprot.writeStructBegin(_STRUCT_DESC);" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_name = get_member_name((*f_iter)->get_name());
    bool could_be_unset = (*f_iter)->get_req() == t_field::T_OPTIONAL;
    if (could_be_unset) {
      indent(out) << "if (" << generate_isset_check(*f_iter) << ")";
      scope_up(out);
    }
    bool null_allowed = type_can_be_null((*f_iter)->get_type());
    if (null_allowed) {
      indent(out) << "if (this." << field_name << " != null)";
      scope_up(out);
    }

    indent(out) << "oprot.writeFieldBegin(_" << constant_name((*f_iter)->get_name())
                << "_FIELD_DESC);" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    // Write field closer
    indent(out) << "oprot.writeFieldEnd();" << endl;

    if (null_allowed) {
      scope_down(out);
    }
    if (could_be_unset) {
      scope_down(out);
    }
  }
  // Write the struct map
  indent(out) << "oprot.writeFieldStop();" << endl << indent() << "oprot.writeStructEnd();"
      << endl;

  scope_down(out, endl2);
}